

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

void * slider_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_slider *x_00;
  _glist *p_Var2;
  t_float tVar3;
  int local_cc;
  int local_ac;
  undefined1 local_98 [8];
  t_iemgui_drawfunctions w_1;
  int local_58;
  int ldy;
  int ldx;
  int h;
  int w;
  t_float v;
  double max;
  double min;
  int local_30;
  int fs;
  int steady;
  int lilo;
  t_slider *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  
  x_00 = (t_slider *)iemgui_new(slider_class);
  fs = 0;
  local_30 = 1;
  min._4_4_ = (x_00->x_gui).x_fontsize;
  max = 0.0;
  _w = 127.0;
  h = 0;
  local_98 = (undefined1  [8])slider_draw_new;
  w_1.draw_new = slider_draw_config;
  w_1.draw_config = slider_draw_io;
  w_1.draw_iolets = slider_draw_update;
  w_1.draw_update = slider_draw_select;
  w_1.draw_select = (t_iemdrawfunptr)0x0;
  w_1.draw_erase = (t_iemdrawfunptr)0x0;
  iemgui_setdrawfunctions((t_iemgui *)x_00,(t_iemgui_drawfunctions *)local_98);
  if (*s->s_name == 'v') {
    x_00->x_orientation = vertical;
  }
  if (x_00->x_orientation == horizontal) {
    p_Var2 = canvas_getcurrent();
    iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
    ldy = iVar1 + 5;
    p_Var2 = canvas_getcurrent();
    iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
    ldx = (int)(((double)(iVar1 + 5) / 15.0) * 128.0);
    local_58 = -2;
    p_Var2 = canvas_getcurrent();
    iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
    w_1.draw_move._4_4_ = (int)((double)((iVar1 + 5) * -8) / 15.0);
  }
  else {
    p_Var2 = canvas_getcurrent();
    iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
    ldx = iVar1 + 5;
    p_Var2 = canvas_getcurrent();
    iVar1 = sys_zoomfontheight(p_Var2->gl_font,1,0);
    ldy = (int)(((double)(iVar1 + 5) / 15.0) * 128.0);
    local_58 = 0;
    w_1.draw_move._4_4_ = -9;
  }
  if ((((((argc == 0x11) || (argc == 0x12)) && (argv->a_type == A_FLOAT)) &&
       ((argv[1].a_type == A_FLOAT && (argv[2].a_type == A_FLOAT)))) &&
      ((argv[3].a_type == A_FLOAT && ((argv[4].a_type == A_FLOAT && (argv[5].a_type == A_FLOAT))))))
     && (((argv[6].a_type == A_SYMBOL || (argv[6].a_type == A_FLOAT)) &&
         ((((argv[7].a_type == A_SYMBOL || (argv[7].a_type == A_FLOAT)) &&
           ((argv[8].a_type == A_SYMBOL || (argv[8].a_type == A_FLOAT)))) &&
          ((((argv[9].a_type == A_FLOAT && (argv[10].a_type == A_FLOAT)) &&
            (argv[0xb].a_type == A_FLOAT)) &&
           ((argv[0xc].a_type == A_FLOAT && (argv[0x10].a_type == A_FLOAT)))))))))) {
    tVar3 = atom_getfloatarg(0,argc,argv);
    ldx = (int)tVar3;
    tVar3 = atom_getfloatarg(1,argc,argv);
    ldy = (int)tVar3;
    tVar3 = atom_getfloatarg(2,argc,argv);
    max = (double)tVar3;
    tVar3 = atom_getfloatarg(3,argc,argv);
    _w = (double)tVar3;
    tVar3 = atom_getfloatarg(4,argc,argv);
    fs = (int)tVar3;
    tVar3 = atom_getfloatarg(5,argc,argv);
    iem_inttosymargs(&(x_00->x_gui).x_isa,(int)tVar3);
    iemgui_new_getnames((t_iemgui *)x_00,6,argv);
    tVar3 = atom_getfloatarg(9,argc,argv);
    local_58 = (int)tVar3;
    tVar3 = atom_getfloatarg(10,argc,argv);
    w_1.draw_move._4_4_ = (int)tVar3;
    tVar3 = atom_getfloatarg(0xb,argc,argv);
    iem_inttofstyle(&(x_00->x_gui).x_fsf,(int)tVar3);
    tVar3 = atom_getfloatarg(0xc,argc,argv);
    min._4_4_ = (int)tVar3;
    iemgui_all_loadcolors((t_iemgui *)x_00,argv + 0xd,argv + 0xe,argv + 0xf);
    h = (int)atom_getfloatarg(0x10,argc,argv);
  }
  else {
    iemgui_new_getnames((t_iemgui *)x_00,6,(t_atom *)0x0);
  }
  if ((argc == 0x12) && (argv[0x11].a_type == A_FLOAT)) {
    tVar3 = atom_getfloatarg(0x11,0x12,argv);
    local_30 = (int)tVar3;
  }
  (x_00->x_gui).x_fsf =
       (t_iem_fstyle_flags)
       ((uint)(x_00->x_gui).x_fsf & 0xffffff7f | (uint)((x_00->x_gui).x_snd != (t_symbol *)0x0) << 7
       );
  (x_00->x_gui).x_fsf =
       (t_iem_fstyle_flags)
       ((uint)(x_00->x_gui).x_fsf & 0xffffffbf | (uint)((x_00->x_gui).x_rcv != (t_symbol *)0x0) << 6
       );
  if (((uint)(x_00->x_gui).x_isa & 1) == 0) {
    x_00->x_val = 0;
  }
  else {
    x_00->x_val = (int)(float)h;
  }
  if (fs != 0) {
    fs = 1;
  }
  x_00->x_lin0_log1 = fs;
  if (local_30 != 0) {
    local_30 = 1;
  }
  x_00->x_steady = local_30;
  if (((uint)(x_00->x_gui).x_fsf & 0x3f) == 1) {
    strcpy((x_00->x_gui).x_font,"helvetica");
  }
  else if (((uint)(x_00->x_gui).x_fsf & 0x3f) == 2) {
    strcpy((x_00->x_gui).x_font,"times");
  }
  else {
    (x_00->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)(x_00->x_gui).x_fsf & 0xffffffc0);
    strcpy((x_00->x_gui).x_font,sys_font);
  }
  if (((uint)(x_00->x_gui).x_fsf >> 6 & 1) != 0) {
    pd_bind((t_pd *)x_00,(x_00->x_gui).x_rcv);
  }
  (x_00->x_gui).x_ldx = local_58;
  (x_00->x_gui).x_ldy = w_1.draw_move._4_4_;
  if (min._4_4_ < 4) {
    local_ac = 4;
  }
  else {
    local_ac = min._4_4_;
  }
  (x_00->x_gui).x_fontsize = local_ac;
  if (x_00->x_orientation == horizontal) {
    iVar1 = slider_check_range(x_00,ldx);
    (x_00->x_gui).x_w = iVar1;
    iVar1 = iemgui_clip_size(ldy);
    (x_00->x_gui).x_h = iVar1;
  }
  else {
    iVar1 = iemgui_clip_size(ldx);
    (x_00->x_gui).x_w = iVar1;
    iVar1 = slider_check_range(x_00,ldy);
    (x_00->x_gui).x_h = iVar1;
  }
  iemgui_verify_snd_ne_rcv((t_iemgui *)x_00);
  iemgui_newzoom((t_iemgui *)x_00);
  if (x_00->x_orientation == horizontal) {
    local_cc = (x_00->x_gui).x_w;
  }
  else {
    local_cc = (x_00->x_gui).x_h;
  }
  slider_check_minmax(x_00,max,_w,(float)local_cc);
  outlet_new((t_object *)x_00,&s_float);
  tVar3 = slider_getfval(x_00);
  x_00->x_fval = tVar3;
  return x_00;
}

Assistant:

static void *slider_new(t_symbol *s, int argc, t_atom *argv)
{
    t_slider *x = (t_slider *)iemgui_new(slider_class);
    int lilo = 0, steady = 1;
    int fs = x->x_gui.x_fontsize;
    double min = 0.0, max = (double)(IEM_SL_DEFAULTSIZE-1);
    t_float v = 0;
    int w, h, ldx, ldy;

    IEMGUI_SETDRAWFUNCTIONS(x, slider);

    if('v' == *s->s_name)
        x->x_orientation = vertical;

    if(x->x_orientation == horizontal)
    {
        w = IEM_SL_DEFAULTSIZE;
        h = IEM_GUI_DEFAULTSIZE;
        w *= IEM_GUI_DEFAULTSIZE_SCALE; /* keep aspect ratio */

        ldx = -2;
        ldy = -8 * IEM_GUI_DEFAULTSIZE_SCALE;
    } else {
        w = IEM_GUI_DEFAULTSIZE;
        h = IEM_SL_DEFAULTSIZE;
        h *= IEM_GUI_DEFAULTSIZE_SCALE; /* keep aspect ratio */

        ldx = 0;
        ldy = -9;
    }

    if(((argc == 17)||(argc == 18))&&IS_A_FLOAT(argv,0)&&IS_A_FLOAT(argv,1)
       &&IS_A_FLOAT(argv,2)&&IS_A_FLOAT(argv,3)
       &&IS_A_FLOAT(argv,4)&&IS_A_FLOAT(argv,5)
       &&(IS_A_SYMBOL(argv,6)||IS_A_FLOAT(argv,6))
       &&(IS_A_SYMBOL(argv,7)||IS_A_FLOAT(argv,7))
       &&(IS_A_SYMBOL(argv,8)||IS_A_FLOAT(argv,8))
       &&IS_A_FLOAT(argv,9)&&IS_A_FLOAT(argv,10)
       &&IS_A_FLOAT(argv,11)&&IS_A_FLOAT(argv,12)&&IS_A_FLOAT(argv,16))
    {
        w = (int)atom_getfloatarg(0, argc, argv);
        h = (int)atom_getfloatarg(1, argc, argv);
        min = (double)atom_getfloatarg(2, argc, argv);
        max = (double)atom_getfloatarg(3, argc, argv);
        lilo = (int)atom_getfloatarg(4, argc, argv);
        iem_inttosymargs(&x->x_gui.x_isa, atom_getfloatarg(5, argc, argv));
        iemgui_new_getnames(&x->x_gui, 6, argv);
        ldx = (int)atom_getfloatarg(9, argc, argv);
        ldy = (int)atom_getfloatarg(10, argc, argv);
        iem_inttofstyle(&x->x_gui.x_fsf, atom_getfloatarg(11, argc, argv));
        fs = (int)atom_getfloatarg(12, argc, argv);
        iemgui_all_loadcolors(&x->x_gui, argv+13, argv+14, argv+15);
        v = atom_getfloatarg(16, argc, argv);
    }
    else iemgui_new_getnames(&x->x_gui, 6, 0);
    if((argc == 18)&&IS_A_FLOAT(argv,17))
        steady = (int)atom_getfloatarg(17, argc, argv);
    x->x_gui.x_fsf.x_snd_able = (0 != x->x_gui.x_snd);
    x->x_gui.x_fsf.x_rcv_able = (0 != x->x_gui.x_rcv);
    if (x->x_gui.x_isa.x_loadinit)
        x->x_val = v;
    else x->x_val = 0;
    if(lilo != 0) lilo = 1;
    x->x_lin0_log1 = lilo;
    if(steady != 0) steady = 1;
    x->x_steady = steady;
    if(x->x_gui.x_fsf.x_font_style == 1) strcpy(x->x_gui.x_font, "helvetica");
    else if(x->x_gui.x_fsf.x_font_style == 2) strcpy(x->x_gui.x_font, "times");
    else { x->x_gui.x_fsf.x_font_style = 0;
        strcpy(x->x_gui.x_font, sys_font); }
    if(x->x_gui.x_fsf.x_rcv_able) pd_bind(&x->x_gui.x_obj.ob_pd, x->x_gui.x_rcv);
    x->x_gui.x_ldx = ldx;
    x->x_gui.x_ldy = ldy;
    x->x_gui.x_fontsize = (fs < 4)?4:fs;

    if(x->x_orientation == horizontal)
    {
        x->x_gui.x_w = slider_check_range(x, w);
        x->x_gui.x_h = iemgui_clip_size(h);
    } else {
        x->x_gui.x_w = iemgui_clip_size(w);
        x->x_gui.x_h = slider_check_range(x, h);
    }

    iemgui_verify_snd_ne_rcv(&x->x_gui);
    iemgui_newzoom(&x->x_gui);
    slider_check_minmax(x, min, max,
        (x->x_orientation==horizontal)?x->x_gui.x_w:x->x_gui.x_h);

    outlet_new(&x->x_gui.x_obj, &s_float);
    x->x_fval = slider_getfval(x);
    return (x);
}